

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::getShaderGroup
          (shaderCollectionForTextureFormat *this,samplingFunction function,
          shaderGroup *shader_group)

{
  shaderDefinition *psVar1;
  
  shader_group->sampling_tesselation_evaluation_shader = (shaderDefinition *)0x0;
  shader_group->sampling_vertex_shader = (shaderDefinition *)0x0;
  shader_group->sampling_geometry_shader = (shaderDefinition *)0x0;
  shader_group->sampling_tesselation_control_shader = (shaderDefinition *)0x0;
  shader_group->sampling_compute_shader = (shaderDefinition *)0x0;
  shader_group->sampling_fragment_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_tesselation_evaluation_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_vertex_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_fragment_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_tesselation_control_shader = (shaderDefinition *)0x0;
  psVar1 = &((this->per_sampling_routine).
             super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
             ._M_impl.super__Vector_impl_data._M_start)->sampling_geometry_shader;
  while( true ) {
    if ((pointer)(psVar1 + -4) ==
        (this->per_sampling_routine).
        super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (*(samplingFunction *)&psVar1[4].m_gl == function) break;
    psVar1 = (shaderDefinition *)&psVar1[8].m_shader_stage;
  }
  shader_group->pass_through_fragment_shader = &this->pass_through_fragment_shader;
  shader_group->pass_through_tesselation_control_shader = psVar1 + -3;
  shader_group->pass_through_tesselation_evaluation_shader =
       &this->pass_through_tesselation_evaluation_shader;
  shader_group->pass_through_vertex_shader = psVar1 + -4;
  shader_group->sampling_compute_shader = psVar1 + -2;
  shader_group->sampling_fragment_shader = psVar1 + -1;
  shader_group->sampling_geometry_shader = psVar1;
  shader_group->sampling_tesselation_control_shader = psVar1 + 1;
  shader_group->sampling_tesselation_evaluation_shader = psVar1 + 2;
  shader_group->sampling_vertex_shader = psVar1 + 3;
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderGroup::init()
{
	pass_through_fragment_shader			   = 0;
	pass_through_tesselation_control_shader	= 0;
	pass_through_tesselation_evaluation_shader = 0;
	pass_through_vertex_shader				   = 0;
	sampling_compute_shader					   = 0;
	sampling_fragment_shader				   = 0;
	sampling_geometry_shader				   = 0;
	sampling_tesselation_control_shader		   = 0;
	sampling_tesselation_evaluation_shader	 = 0;
	sampling_vertex_shader					   = 0;
}